

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmath.c
# Opt level: O0

void xvm_sub(double *r,double *x,double *y,uint64_t N)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  ulong local_c0;
  __m128d r1;
  __m128d r0;
  __m128d y1;
  __m128d y0;
  __m128d x1;
  __m128d x0;
  uint64_t n;
  uint64_t N_local;
  double *y_local;
  
  for (local_c0 = 0; local_c0 < N; local_c0 = local_c0 + 4) {
    dVar1 = (x + local_c0)[1];
    dVar2 = x[local_c0 + 2];
    dVar3 = x[local_c0 + 3];
    dVar4 = (y + local_c0)[1];
    dVar5 = y[local_c0 + 2];
    dVar6 = y[local_c0 + 3];
    r[local_c0] = x[local_c0] - y[local_c0];
    (r + local_c0)[1] = dVar1 - dVar4;
    r[local_c0 + 2] = dVar2 - dVar5;
    r[local_c0 + 3] = dVar3 - dVar6;
  }
  return;
}

Assistant:

void xvm_sub(double r[], const double x[], const double y[], uint64_t N) {
#if defined(__SSE2__) && !defined(XVM_ANSI)
	assert(r != NULL && ((uintptr_t)r % 16) == 0);
	assert(x != NULL && ((uintptr_t)x % 16) == 0);
	assert(y != NULL && ((uintptr_t)y % 16) == 0);
	for (uint64_t n = 0; n < N; n += 4) {
		const __m128d x0 = _mm_load_pd(x + n    );
		const __m128d x1 = _mm_load_pd(x + n + 2);
		const __m128d y0 = _mm_load_pd(y + n    );
		const __m128d y1 = _mm_load_pd(y + n + 2);
		const __m128d r0 = _mm_sub_pd(x0, y0);
		const __m128d r1 = _mm_sub_pd(x1, y1);
		_mm_store_pd(r + n,     r0);
		_mm_store_pd(r + n + 2, r1);
	}
#else
	for (uint64_t n = 0; n < N; n++)
		r[n] = x[n] - y[n];
#endif
}